

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O0

void __thiscall dynamicgraph::TracerRealTime::TracerRealTime(TracerRealTime *this,string *n)

{
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  string local_110;
  allocator<char> local_e9;
  string local_e8 [32];
  code *local_c8;
  undefined8 local_c0;
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  string doc;
  string local_38 [32];
  string *local_18;
  string *n_local;
  TracerRealTime *this_local;
  
  local_18 = n;
  n_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)n);
  dynamicgraph::Tracer::Tracer(&this->super_Tracer,local_38);
  std::__cxx11::string::~string(local_38);
  *(undefined ***)this = &PTR__TracerRealTime_0013b030;
  this->bufferSize = 0x100000;
  std::__cxx11::
  list<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
  ::list(&this->hardFiles);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Trash the current content of the buffers, without saving it.",
             &local_89);
  command::docCommandVoid0((string *)local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"empty",&local_b1);
  local_c8 = emptyBuffers;
  local_c0 = 0;
  command::makeCommandVoid0<dynamicgraph::TracerRealTime>
            ((command *)this,(TracerRealTime *)emptyBuffers,0,(string *)local_68);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"getBufferSize",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"bufferSize",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"int",&local_159);
  command::docDirectGetter(&local_110,&local_130,&local_158);
  command::makeDirectGetter<dynamicgraph::TracerRealTime,int>(this,&this->bufferSize,&local_110);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_e8);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"setBufferSize",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"bufferSize",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"int",&local_1f1);
  command::docDirectSetter(&local_1a8,&local_1c8,&local_1f0);
  command::makeDirectSetter<dynamicgraph::TracerRealTime,int>(this,&this->bufferSize,&local_1a8);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_180);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

TracerRealTime::TracerRealTime(const std::string &n)
    : Tracer(n), bufferSize(BUFFER_SIZE_DEFAULT) {
  dgDEBUGINOUT(15);

  /* --- Commands --- */
  {
    using namespace dynamicgraph::command;
    std::string doc = docCommandVoid0(
        "Trash the current content of the buffers, without saving it.");
    addCommand("empty",
               makeCommandVoid0(*this, &TracerRealTime::emptyBuffers, doc));

    addCommand("getBufferSize",
               makeDirectGetter(*this, &bufferSize,
                                docDirectGetter("bufferSize", "int")));
    addCommand("setBufferSize",
               makeDirectSetter(*this, &bufferSize,
                                docDirectSetter("bufferSize", "int")));
  }  // using namespace command

  dgDEBUGOUT(15);
}